

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

int __thiscall asmjit::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  SectionEntry *se;
  Error err;
  char *in_stack_000002e0;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  uint in_stack_fffffffffffffef8;
  Zone *this_00;
  ZoneHeap *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Error local_cc;
  
  if ((this->_codeInfo)._archInfo.field_0.field_0._type == '\0') {
    if (this->_emitters != (CodeEmitter *)0x0) {
      DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
    }
    this_00 = (Zone *)&this->_sections;
    if ((this->_sections).super_ZoneVectorBase._capacity ==
        (this->_sections).super_ZoneVectorBase._length) {
      local_cc = ZoneVectorBase::_grow
                           ((ZoneVectorBase *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            in_stack_ffffffffffffff10,(size_t)this,(size_t)this_00);
    }
    else {
      local_cc = 0;
    }
    if (local_cc == 0) {
      in_stack_ffffffffffffff10 =
           (ZoneHeap *)Zone::allocZeroed(this_00,(ulong)in_stack_fffffffffffffef8);
      if (in_stack_ffffffffffffff10 == (ZoneHeap *)0x0) {
        local_cc = 1;
      }
      else {
        *(undefined4 *)((long)&in_stack_ffffffffffffff10->_zone + 4) = 3;
        *(undefined4 *)(in_stack_ffffffffffffff10->_slots + 1) = 0x7865742e;
        *(undefined4 *)((long)in_stack_ffffffffffffff10->_slots + 0xc) = 0x74;
        if ((this->_sections).super_ZoneVectorBase._capacity <=
            (this->_sections).super_ZoneVectorBase._length) {
          DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
        }
        *(ZoneHeap **)
         ((long)(this->_sections).super_ZoneVectorBase._data +
         (this->_sections).super_ZoneVectorBase._length * 8) = in_stack_ffffffffffffff10;
        (this->_sections).super_ZoneVectorBase._length =
             (this->_sections).super_ZoneVectorBase._length + 1;
      }
    }
    if (local_cc == 0) {
      (this->_codeInfo)._archInfo.field_0.field_0 =
           *(anon_struct_4_4_3fa876f7_for_anon_union_4_2_424c626f_for_ArchInfo_0_0 *)ctx;
      (this->_codeInfo).field_1 = *(anon_union_4_2_314a35c9_for_CodeInfo_1 *)(ctx + 4);
      (this->_codeInfo)._baseAddress = *(uint64_t *)(ctx + 8);
      local_cc = 0;
    }
    else {
      Zone::reset((Zone *)in_stack_ffffffffffffff10,SUB81((ulong)this >> 0x38,0));
    }
  }
  else {
    local_cc = 7;
  }
  return local_cc;
}

Assistant:

Error CodeHolder::init(const CodeInfo& info) noexcept {
  // Cannot reinitialize if it's locked or there is one or more CodeEmitter
  // attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached).
  ASMJIT_ASSERT(_emitters == nullptr);

  // Create the default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_baseHeap);
  if (err == kErrorOk) {
    SectionEntry* se = _baseZone.allocZeroedT<SectionEntry>();
    if (ASMJIT_LIKELY(se)) {
      se->_flags = SectionEntry::kFlagExec | SectionEntry::kFlagConst;
      se->_setDefaultName('.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(se);
    }
    else {
      err = DebugUtils::errored(kErrorNoHeapMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _baseZone.reset(false);
    return err;
  }
  else {
    _codeInfo = info;
    return kErrorOk;
  }
}